

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O2

void __thiscall QWidgetPrivate::stackUnder_sys(QWidgetPrivate *this,QWidget *param_1)

{
  long lVar1;
  long lVar2;
  QWidgetPrivate *this_00;
  long in_FS_OFFSET;
  QRect local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  lVar2 = *(long *)(*(long *)(lVar1 + 8) + 0x10);
  if (lVar2 != 0) {
    setDirtyOpaqueRegion(this);
    this_00 = *(QWidgetPrivate **)(lVar2 + 8);
    local_30 = effectiveRectFor(this,(QRect *)(*(long *)(lVar1 + 0x20) + 0x14));
    invalidateBackingStore<QRect>(this_00,&local_30);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QWidgetPrivate::stackUnder_sys(QWidget*)
{
    Q_Q(QWidget);
    if (QWidget *p = q->parentWidget()) {
        setDirtyOpaqueRegion();
        p->d_func()->invalidateBackingStore(effectiveRectFor(q->geometry()));
    }
}